

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.cpp
# Opt level: O0

void __thiscall Ball::draw(Ball *this,Graphics *g)

{
  float a;
  vec4 color_00;
  vec4 color_01;
  Graphics *pGVar1;
  int iVar2;
  size_type sVar3;
  int *piVar4;
  reference pvVar5;
  int local_84;
  int local_80;
  int local_7c;
  undefined8 uStack_78;
  int i;
  undefined1 auStack_64 [8];
  vec4 color;
  __cxx11 local_48 [32];
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_28;
  Graphics *local_18;
  Graphics *g_local;
  Ball *this_local;
  
  local_18 = g;
  g_local = (Graphics *)this;
  piksel::Graphics::push(g);
  iVar2 = piksel::Graphics::millis(local_18);
  iVar2 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar2);
  pGVar1 = local_18;
  if (iVar2 < 3000) {
    glm::vec<4,_float,_(glm::qualifier)0>::vec
              ((vec<4,_float,_(glm::qualifier)0> *)&local_28.field_0,1.0,1.0,1.0,1.0);
    piksel::Graphics::fill(pGVar1,(vec4)local_28);
    piksel::Graphics::textSize(local_18,16.0);
    pGVar1 = local_18;
    iVar2 = piksel::Graphics::millis(local_18);
    iVar2 = piksel::Timer::getElapsedTimeInMillis(&this->respawnTimer,iVar2);
    std::__cxx11::to_string(local_48,3 - iVar2 / 1000);
    piksel::Graphics::text
              (pGVar1,(string *)local_48,
               ((this->velocity).field_0.field_0.x * 4.0 +
               (this->super_AABB).center.field_0.field_0.x) - 4.0,
               (this->velocity).field_0.field_0.y * 4.0 +
               (this->super_AABB).center.field_0.field_0.y + 8.0);
    std::__cxx11::string::~string((string *)local_48);
  }
  piksel::Graphics::rectMode(local_18,RADIUS);
  piksel::Graphics::noStroke(local_18);
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            ((vec<4,_float,_(glm::qualifier)0> *)auStack_64,0.7764706,0.28627452,0.29411766,1.0);
  color_01.field_0.field_0.w = color.field_0.field_0.y;
  color_01.field_0.field_0.z = color.field_0.field_0.x;
  uStack_78 = auStack_64;
  color_01.field_0._0_8_ = auStack_64;
  piksel::Graphics::fill(local_18,color_01);
  piksel::Graphics::rect
            (local_18,(this->super_AABB).center.field_0.field_0.x,
             (this->super_AABB).center.field_0.field_0.y,
             (this->super_AABB).halfDimension.field_0.field_0.x,
             (this->super_AABB).halfDimension.field_0.field_0.y);
  local_7c = 0;
  while( true ) {
    iVar2 = local_7c;
    sVar3 = std::
            deque<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
            ::size(&this->prevCenters);
    local_80 = (int)sVar3;
    local_84 = 6;
    piVar4 = std::min<int>(&local_80,&local_84);
    if (*piVar4 <= iVar2) break;
    color.field_0.field_0.y = color.field_0.field_0.y + -0.15;
    color_00.field_0.field_0.w = color.field_0.field_0.y;
    color_00.field_0.field_0.z = color.field_0.field_0.x;
    color_00.field_0._0_8_ = auStack_64;
    piksel::Graphics::fill(local_18,color_00);
    pGVar1 = local_18;
    pvVar5 = std::
             deque<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ::operator[](&this->prevCenters,(long)local_7c);
    a = (pvVar5->field_0).field_0.x;
    pvVar5 = std::
             deque<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
             ::operator[](&this->prevCenters,(long)local_7c);
    piksel::Graphics::rect
              (pGVar1,a,(pvVar5->field_0).field_0.y,
               (this->super_AABB).halfDimension.field_0.field_0.x,
               (this->super_AABB).halfDimension.field_0.field_0.y);
    local_7c = local_7c + 1;
  }
  piksel::Graphics::pop(local_18);
  return;
}

Assistant:

void Ball::draw(piksel::Graphics& g) {
    g.push();
    if (respawnTimer.getElapsedTimeInMillis(g.millis()) < 3000) {
        g.fill(WHITE);
        g.textSize(16);
        g.text(std::to_string(3 - respawnTimer.getElapsedTimeInMillis(g.millis()) / 1000), center.x + 4.0f * velocity.x - 4.0f, center.y + 4.0f * velocity.y + 8.0f);
    }
    g.rectMode(piksel::DrawMode::RADIUS);
    g.noStroke();
    glm::vec4 color = RED;
    g.fill(color);
    g.rect(center.x, center.y, halfDimension.x, halfDimension.y);
    for (int i = 0; i < std::min<int>(prevCenters.size(), 6); i++) {
        color.a -= 0.15f;
        g.fill(color);
        g.rect(prevCenters[i].x, prevCenters[i].y, halfDimension.x, halfDimension.y);
    }
    g.pop();
}